

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_sse2_intrinsics.c
# Opt level: O2

void png_read_filter_row_paeth4_sse2(png_row_infop row_info,png_bytep row,png_const_bytep prev)

{
  undefined4 uVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  undefined7 uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  char cVar17;
  ushort uVar18;
  char cVar23;
  ushort uVar24;
  char cVar25;
  ushort uVar26;
  char cVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  ushort uVar32;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  short sVar33;
  ushort uVar34;
  short sVar36;
  ushort uVar37;
  short sVar38;
  ushort uVar39;
  short sVar40;
  ushort uVar41;
  short sVar42;
  ushort uVar43;
  short sVar44;
  ushort uVar45;
  short sVar46;
  ushort uVar47;
  short sVar48;
  ushort uVar49;
  undefined1 auVar35 [16];
  short sVar50;
  ushort uVar51;
  short sVar52;
  ushort uVar53;
  short sVar54;
  ushort uVar55;
  short sVar56;
  ushort uVar57;
  short sVar58;
  ushort uVar59;
  short sVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  short sVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  ushort uVar71;
  ushort uVar72;
  ushort uVar73;
  byte bVar11;
  undefined4 uVar19;
  undefined6 uVar20;
  
  lVar9 = 0;
  auVar12 = (undefined1  [16])0x0;
  auVar22 = (undefined1  [16])0x0;
  for (uVar8 = row_info->rowbytes + 4; 4 < uVar8; uVar8 = uVar8 - 4) {
    uVar1 = *(undefined4 *)(prev + lVar9);
    bVar11 = (byte)((uint)uVar1 >> 0x18);
    uVar6 = CONCAT25((short)(((uint7)bVar11 << 0x30) >> 0x28),
                     CONCAT14((char)((uint)uVar1 >> 0x10),uVar1));
    uVar18 = (ushort)uVar1;
    uVar7 = (ulong)CONCAT43((int)(CONCAT34((int3)((uint7)uVar6 >> 0x20),uVar1) >> 0x18),
                            CONCAT12((char)((uint)uVar1 >> 8),uVar18)) & 0xffffffff00ffffff;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = CONCAT62((int6)(uVar7 >> 0x10),uVar18) & 0xffffffffffff00ff;
    uVar1 = *(undefined4 *)(row + lVar9);
    sVar33 = (uVar18 & 0xff) - auVar22._0_2_;
    sVar36 = (short)(uVar7 >> 0x10) - auVar22._2_2_;
    sVar38 = (short)((uint7)uVar6 >> 0x20) - auVar22._4_2_;
    sVar40 = (ushort)bVar11 - auVar22._6_2_;
    sVar13 = auVar22._8_2_;
    sVar42 = -sVar13;
    sVar14 = auVar22._10_2_;
    sVar44 = -sVar14;
    sVar15 = auVar22._12_2_;
    sVar46 = -sVar15;
    sVar16 = auVar22._14_2_;
    sVar48 = -sVar16;
    sVar50 = auVar12._0_2_ - auVar22._0_2_;
    sVar52 = auVar12._2_2_ - auVar22._2_2_;
    sVar54 = auVar12._4_2_ - auVar22._4_2_;
    sVar56 = auVar12._6_2_ - auVar22._6_2_;
    sVar58 = auVar12._8_2_ - sVar13;
    sVar60 = auVar12._10_2_ - sVar14;
    sVar62 = auVar12._12_2_ - sVar15;
    sVar64 = auVar12._14_2_ - sVar16;
    sVar2 = -sVar33;
    sVar3 = -sVar36;
    sVar4 = -sVar38;
    sVar5 = -sVar40;
    uVar18 = (ushort)(sVar2 < sVar33) * sVar33 | (ushort)(sVar2 >= sVar33) * sVar2;
    uVar24 = (ushort)(sVar3 < sVar36) * sVar36 | (ushort)(sVar3 >= sVar36) * sVar3;
    uVar26 = (ushort)(sVar4 < sVar38) * sVar38 | (ushort)(sVar4 >= sVar38) * sVar4;
    uVar28 = (ushort)(sVar5 < sVar40) * sVar40 | (ushort)(sVar5 >= sVar40) * sVar5;
    uVar29 = (ushort)(sVar13 < sVar42) * sVar42 | (ushort)(sVar13 >= sVar42) * sVar13;
    uVar30 = (ushort)(sVar14 < sVar44) * sVar44 | (ushort)(sVar14 >= sVar44) * sVar14;
    uVar31 = (ushort)(sVar15 < sVar46) * sVar46 | (ushort)(sVar15 >= sVar46) * sVar15;
    uVar32 = (ushort)(sVar16 < sVar48) * sVar48 | (ushort)(sVar16 >= sVar48) * sVar16;
    sVar33 = sVar33 + sVar50;
    sVar36 = sVar36 + sVar52;
    sVar38 = sVar38 + sVar54;
    sVar40 = sVar40 + sVar56;
    sVar42 = sVar42 + sVar58;
    sVar44 = sVar44 + sVar60;
    sVar46 = sVar46 + sVar62;
    sVar48 = sVar48 + sVar64;
    sVar2 = -sVar50;
    sVar3 = -sVar52;
    sVar4 = -sVar54;
    sVar5 = -sVar56;
    sVar13 = -sVar58;
    sVar14 = -sVar60;
    sVar15 = -sVar62;
    sVar16 = -sVar64;
    uVar66 = (ushort)(sVar2 < sVar50) * sVar50 | (ushort)(sVar2 >= sVar50) * sVar2;
    uVar67 = (ushort)(sVar3 < sVar52) * sVar52 | (ushort)(sVar3 >= sVar52) * sVar3;
    uVar68 = (ushort)(sVar4 < sVar54) * sVar54 | (ushort)(sVar4 >= sVar54) * sVar4;
    uVar69 = (ushort)(sVar5 < sVar56) * sVar56 | (ushort)(sVar5 >= sVar56) * sVar5;
    uVar70 = (ushort)(sVar13 < sVar58) * sVar58 | (ushort)(sVar13 >= sVar58) * sVar13;
    uVar71 = (ushort)(sVar14 < sVar60) * sVar60 | (ushort)(sVar14 >= sVar60) * sVar14;
    uVar72 = (ushort)(sVar15 < sVar62) * sVar62 | (ushort)(sVar15 >= sVar62) * sVar15;
    uVar73 = (ushort)(sVar16 < sVar64) * sVar64 | (ushort)(sVar16 >= sVar64) * sVar16;
    sVar2 = -sVar33;
    sVar3 = -sVar36;
    sVar4 = -sVar38;
    sVar5 = -sVar40;
    sVar13 = -sVar42;
    sVar14 = -sVar44;
    sVar15 = -sVar46;
    sVar16 = -sVar48;
    uVar51 = (ushort)(sVar2 < sVar33) * sVar33 | (ushort)(sVar2 >= sVar33) * sVar2;
    uVar53 = (ushort)(sVar3 < sVar36) * sVar36 | (ushort)(sVar3 >= sVar36) * sVar3;
    uVar55 = (ushort)(sVar4 < sVar38) * sVar38 | (ushort)(sVar4 >= sVar38) * sVar4;
    uVar57 = (ushort)(sVar5 < sVar40) * sVar40 | (ushort)(sVar5 >= sVar40) * sVar5;
    uVar59 = (ushort)(sVar13 < sVar42) * sVar42 | (ushort)(sVar13 >= sVar42) * sVar13;
    uVar61 = (ushort)(sVar14 < sVar44) * sVar44 | (ushort)(sVar14 >= sVar44) * sVar14;
    uVar63 = (ushort)(sVar15 < sVar46) * sVar46 | (ushort)(sVar15 >= sVar46) * sVar15;
    uVar65 = (ushort)(sVar16 < sVar48) * sVar48 | (ushort)(sVar16 >= sVar48) * sVar16;
    uVar34 = ((short)uVar66 < (short)uVar18) * uVar66 | ((short)uVar66 >= (short)uVar18) * uVar18;
    uVar37 = ((short)uVar67 < (short)uVar24) * uVar67 | ((short)uVar67 >= (short)uVar24) * uVar24;
    uVar39 = ((short)uVar68 < (short)uVar26) * uVar68 | ((short)uVar68 >= (short)uVar26) * uVar26;
    uVar41 = ((short)uVar69 < (short)uVar28) * uVar69 | ((short)uVar69 >= (short)uVar28) * uVar28;
    uVar43 = ((short)uVar70 < (short)uVar29) * uVar70 | ((short)uVar70 >= (short)uVar29) * uVar29;
    uVar45 = ((short)uVar71 < (short)uVar30) * uVar71 | ((short)uVar71 >= (short)uVar30) * uVar30;
    uVar47 = ((short)uVar72 < (short)uVar31) * uVar72 | ((short)uVar72 >= (short)uVar31) * uVar31;
    uVar49 = ((short)uVar73 < (short)uVar32) * uVar73 | ((short)uVar73 >= (short)uVar32) * uVar32;
    uVar34 = ((short)uVar51 < (short)uVar34) * uVar51 | ((short)uVar51 >= (short)uVar34) * uVar34;
    uVar37 = ((short)uVar53 < (short)uVar37) * uVar53 | ((short)uVar53 >= (short)uVar37) * uVar37;
    uVar39 = ((short)uVar55 < (short)uVar39) * uVar55 | ((short)uVar55 >= (short)uVar39) * uVar39;
    uVar41 = ((short)uVar57 < (short)uVar41) * uVar57 | ((short)uVar57 >= (short)uVar41) * uVar41;
    uVar43 = ((short)uVar59 < (short)uVar43) * uVar59 | ((short)uVar59 >= (short)uVar43) * uVar43;
    uVar45 = ((short)uVar61 < (short)uVar45) * uVar61 | ((short)uVar61 >= (short)uVar45) * uVar45;
    uVar47 = ((short)uVar63 < (short)uVar47) * uVar63 | ((short)uVar63 >= (short)uVar47) * uVar47;
    uVar49 = ((short)uVar65 < (short)uVar49) * uVar65 | ((short)uVar65 >= (short)uVar49) * uVar49;
    auVar21._0_2_ = -(ushort)(uVar18 == uVar34);
    auVar21._2_2_ = -(ushort)(uVar24 == uVar37);
    auVar21._4_2_ = -(ushort)(uVar26 == uVar39);
    auVar21._6_2_ = -(ushort)(uVar28 == uVar41);
    auVar21._8_2_ = -(ushort)(uVar29 == uVar43);
    auVar21._10_2_ = -(ushort)(uVar30 == uVar45);
    auVar21._12_2_ = -(ushort)(uVar31 == uVar47);
    auVar21._14_2_ = -(ushort)(uVar32 == uVar49);
    auVar35._0_2_ = -(ushort)(uVar34 == uVar66);
    auVar35._2_2_ = -(ushort)(uVar37 == uVar67);
    auVar35._4_2_ = -(ushort)(uVar39 == uVar68);
    auVar35._6_2_ = -(ushort)(uVar41 == uVar69);
    auVar35._8_2_ = -(ushort)(uVar43 == uVar70);
    auVar35._10_2_ = -(ushort)(uVar45 == uVar71);
    auVar35._12_2_ = -(ushort)(uVar47 == uVar72);
    auVar35._14_2_ = -(ushort)(uVar49 == uVar73);
    auVar22 = ~auVar21 & (~auVar35 & auVar22 | auVar10 & auVar35) | auVar12 & auVar21;
    cVar17 = auVar22[0] + (char)uVar1;
    sVar48 = CONCAT11(auVar22[1],cVar17);
    cVar23 = auVar22[2] + (char)((uint)uVar1 >> 8);
    uVar19 = CONCAT13(auVar22[3],CONCAT12(cVar23,sVar48));
    cVar25 = auVar22[4] + (char)((uint)uVar1 >> 0x10);
    uVar20 = CONCAT15(auVar22[5],CONCAT14(cVar25,uVar19));
    cVar27 = auVar22[6] + (char)((uint)uVar1 >> 0x18);
    auVar12._0_8_ = CONCAT17(auVar22[7],CONCAT16(cVar27,uVar20));
    auVar12[8] = auVar22[8];
    auVar12[9] = auVar22[9];
    auVar12[10] = auVar22[10];
    auVar12[0xb] = auVar22[0xb];
    auVar12[0xc] = auVar22[0xc];
    auVar12[0xd] = auVar22[0xd];
    auVar12[0xe] = auVar22[0xe];
    auVar12[0xf] = auVar22[0xf];
    sVar42 = (short)((uint)uVar19 >> 0x10);
    sVar44 = (short)((uint6)uVar20 >> 0x20);
    sVar46 = (short)((ulong)auVar12._0_8_ >> 0x30);
    *(uint *)(row + lVar9) =
         CONCAT13((0 < sVar46) * (sVar46 < 0x100) * cVar27 - (0xff < sVar46),
                  CONCAT12((0 < sVar44) * (sVar44 < 0x100) * cVar25 - (0xff < sVar44),
                           CONCAT11((0 < sVar42) * (sVar42 < 0x100) * cVar23 - (0xff < sVar42),
                                    (0 < sVar48) * (sVar48 < 0x100) * cVar17 - (0xff < sVar48))));
    lVar9 = lVar9 + 4;
    auVar22 = auVar10;
  }
  return;
}

Assistant:

void png_read_filter_row_paeth4_sse2(png_row_infop row_info, png_bytep row,
   png_const_bytep prev)
{
   /* Paeth tries to predict pixel d using the pixel to the left of it, a,
    * and two pixels from the previous row, b and c:
    *   prev: c b
    *   row:  a d
    * The Paeth function predicts d to be whichever of a, b, or c is nearest to
    * p=a+b-c.
    *
    * The first pixel has no left context, and so uses an Up filter, p = b.
    * This works naturally with our main loop's p = a+b-c if we force a and c
    * to zero.
    * Here we zero b and d, which become c and a respectively at the start of
    * the loop.
    */
   size_t rb;
   const __m128i zero = _mm_setzero_si128();
   __m128i pa,pb,pc,smallest,nearest;
   __m128i c, b = zero,
           a, d = zero;

   png_debug(1, "in png_read_filter_row_paeth4_sse2");

   rb = row_info->rowbytes+4;
   while (rb > 4) {
      /* It's easiest to do this math (particularly, deal with pc) with 16-bit
       * intermediates.
       */
      c = b; b = _mm_unpacklo_epi8(load4(prev), zero);
      a = d; d = _mm_unpacklo_epi8(load4(row ), zero);

      /* (p-a) == (a+b-c - a) == (b-c) */
      pa = _mm_sub_epi16(b,c);

      /* (p-b) == (a+b-c - b) == (a-c) */
      pb = _mm_sub_epi16(a,c);

      /* (p-c) == (a+b-c - c) == (a+b-c-c) == (b-c)+(a-c) */
      pc = _mm_add_epi16(pa,pb);

      pa = abs_i16(pa);  /* |p-a| */
      pb = abs_i16(pb);  /* |p-b| */
      pc = abs_i16(pc);  /* |p-c| */

      smallest = _mm_min_epi16(pc, _mm_min_epi16(pa, pb));

      /* Paeth breaks ties favoring a over b over c. */
      nearest  = if_then_else(_mm_cmpeq_epi16(smallest, pa), a,
                         if_then_else(_mm_cmpeq_epi16(smallest, pb), b,
                                                                     c));

      /* Note `_epi8`: we need addition to wrap modulo 255. */
      d = _mm_add_epi8(d, nearest);
      store4(row, _mm_packus_epi16(d,d));

      prev += 4;
      row  += 4;
      rb   -= 4;
   }
}